

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopScope(cmMakefile *this)

{
  cmGlobalGenerator *this_00;
  cmFileLockPool *this_01;
  Internals *this_02;
  cmMakefile *this_local;
  
  this_00 = GetGlobalGenerator(this);
  this_01 = cmGlobalGenerator::GetFileLockPool(this_00);
  cmFileLockPool::PopFunctionScope(this_01);
  PopLoopBlockBarrier(this);
  CheckForUnusedVariables(this);
  this_02 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  Internals::PopDefinitions(this_02);
  return;
}

Assistant:

void cmMakefile::PopScope()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();

  this->CheckForUnusedVariables();

  this->Internal->PopDefinitions();
}